

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bits * __thiscall lan::db::read_all_bits(db *this,string *content)

{
  db_bit *pdVar1;
  db_bit *pdVar2;
  db_bit *f_bit;
  db_bit *bit;
  string str;
  string *content_local;
  db *this_local;
  
  str.field_2._8_8_ = content;
  std::__cxx11::string::string((string *)&bit);
  pdVar1 = read_bit(this,content);
  for (f_bit = pdVar1; f_bit != (db_bit *)0x0; f_bit = f_bit->nex) {
    pdVar2 = read_bit(this,content);
    f_bit->nex = pdVar2;
  }
  std::__cxx11::string::~string((string *)&bit);
  return pdVar1;
}

Assistant:

lan::db_bits * db::read_all_bits(std::string content){
            std::string str;
            db_bit * bit = nullptr, * f_bit;
            f_bit = bit = read_bit(content);
            while(bit) {
                bit->nex = read_bit(content);
                bit = bit->nex;
            } return f_bit;
        }